

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTimeConstraint.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_31bae::TestTimeConstraintFailureIncludesCorrectData::RunImpl
          (TestTimeConstraintFailureIncludesCorrectData *this)

{
  TestResults *pTVar1;
  bool bVar2;
  char *pcVar3;
  TestResults **ppTVar4;
  TestDetails **ppTVar5;
  TestDetails local_960 [2];
  TestDetails local_920;
  int local_8fc [9];
  TestDetails local_8d8;
  undefined1 local_8b8 [8];
  TimeConstraint t;
  TestDetails details;
  ScopedCurrentTest scopedResult;
  undefined1 local_858 [8];
  TestResults result;
  RecordingReporter reporter;
  TestTimeConstraintFailureIncludesCorrectData *this_local;
  
  reporter._2088_8_ = this;
  RecordingReporter::RecordingReporter((RecordingReporter *)&result.m_failureCount);
  UnitTest::TestResults::TestResults
            ((TestResults *)local_858,(TestReporter *)&result.m_failureCount);
  ScopedCurrentTest::ScopedCurrentTest
            ((ScopedCurrentTest *)&details.lineNumber,(TestResults *)local_858,(TestDetails *)0x0);
  UnitTest::TestDetails::TestDetails((TestDetails *)&t.m_maxMs,"testname","suitename","filename",10)
  ;
  UnitTest::TimeConstraint::TimeConstraint((TimeConstraint *)local_8b8,10,(TestDetails *)&t.m_maxMs)
  ;
  UnitTest::TimeHelpers::SleepMs(0x14);
  UnitTest::TimeConstraint::~TimeConstraint((TimeConstraint *)local_8b8);
  ScopedCurrentTest::~ScopedCurrentTest((ScopedCurrentTest *)&details.lineNumber);
  pcVar3 = strstr(reporter.lastStartedTest + 0xfc,"filename");
  bVar2 = UnitTest::Check<char*>(pcVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_8d8,*ppTVar5,0x30);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_8d8,"strstr(reporter.lastFailedFile, \"filename\")");
  }
  ppTVar4 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar4;
  local_8fc[0] = 10;
  ppTVar5 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_920,*ppTVar5,0x31);
  UnitTest::CheckEqual<int,int>(pTVar1,local_8fc,(int *)(reporter.lastFailedFile + 0xf8),&local_920)
  ;
  pcVar3 = strstr(reporter.lastFailedSuite + 0xf8,"testname");
  bVar2 = UnitTest::Check<char*>(pcVar3);
  if (!bVar2) {
    ppTVar4 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar5 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(local_960,*ppTVar5,0x32);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,local_960,"strstr(reporter.lastFailedTest, \"testname\")");
  }
  RecordingReporter::~RecordingReporter((RecordingReporter *)&result.m_failureCount);
  return;
}

Assistant:

TEST(TimeConstraintFailureIncludesCorrectData)
{
    RecordingReporter reporter;
    TestResults result(&reporter);
    {
		ScopedCurrentTest scopedResult(result);

		TestDetails const details("testname", "suitename", "filename", 10);
        TimeConstraint t(10, details);
        TimeHelpers::SleepMs(20);
    }

	using namespace std;

	CHECK(strstr(reporter.lastFailedFile, "filename"));
    CHECK_EQUAL(10, reporter.lastFailedLine);
    CHECK(strstr(reporter.lastFailedTest, "testname"));
}